

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUse(Parser *this)

{
  Token *pTVar1;
  Lexer *pLVar2;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  bool bVar8;
  Lexer *pLVar9;
  BiOpExpr *biopexpr;
  Parser *in_RSI;
  pointer __p;
  pointer __p_1;
  Exprs exprs;
  undefined1 local_88 [48];
  Position local_58;
  
  sanityExpect(in_RSI,TOK_KW_USE);
  bVar8 = expect(in_RSI,TOK_KW_MOD);
  if (bVar8) {
    pTVar1 = in_RSI->lexer->currentToken;
    bVar8 = expect(in_RSI,TOK_ID);
    if (bVar8) {
      pLVar2 = in_RSI->lexer;
      pLVar9 = (Lexer *)operator_new(0x40);
      ProgNameExpr::ProgNameExpr((ProgNameExpr *)pLVar9,pLVar2,pTVar1);
      local_58.line = 0;
      this->lexer = pLVar9;
      std::unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_>::
      ~unique_ptr((unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_> *)
                  (local_88 + 0x30));
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)this;
    }
    pTVar1 = in_RSI->lexer->currentToken;
    local_58.line = (size_t)operator_new(0x38);
    sVar5 = (pTVar1->pos).endIndex;
    ((Error<pfederc::SyntaxErrorCode> *)local_58.line)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)local_58.line)->err = STX_ERR_EXPECTED_ID;
    sVar6 = (pTVar1->pos).startIndex;
    (((Error<pfederc::SyntaxErrorCode> *)local_58.line)->pos).line = (pTVar1->pos).line;
    (((Error<pfederc::SyntaxErrorCode> *)local_58.line)->pos).startIndex = sVar6;
    (((Error<pfederc::SyntaxErrorCode> *)local_58.line)->pos).endIndex = sVar5;
    (((Error<pfederc::SyntaxErrorCode> *)local_58.line)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(((Error<pfederc::SyntaxErrorCode> *)local_58.line)->extraPos).
             super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl + 8)
         = (pointer)0x0;
    *(pointer *)
     ((long)&(((Error<pfederc::SyntaxErrorCode> *)local_58.line)->extraPos).
             super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl +
     0x10) = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if ((Error<pfederc::SyntaxErrorCode> *)local_58.line != (Error<pfederc::SyntaxErrorCode> *)0x0)
    {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)(local_88 + 0x30),
                 (Error<pfederc::SyntaxErrorCode> *)local_58.line);
    }
  }
  else {
    parseExpression((Parser *)local_88,(Precedence)in_RSI);
    if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
      local_58.line = ((Position *)(local_88._0_8_ + 0x20))->line;
      local_58.startIndex =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&((Position *)(local_88._0_8_ + 0x20))->startIndex)->_M_allocated_capacity;
      local_58.endIndex = ((Position *)(local_88._0_8_ + 0x20))->endIndex;
      local_88._16_8_ = (pointer)0x0;
      local_88._24_8_ = (pointer)0x0;
      local_88._32_8_ = 0;
      if (*(int *)&(((string *)(local_88._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
        do {
          uVar7 = local_88._0_8_;
          if (*(undefined ***)local_88._0_8_ != &PTR__BiOpExpr_0012b990) {
            __cxa_bad_cast();
          }
          if (*(short *)(local_88._0_8_ + 0x40) != 0x2e) break;
          local_88._8_8_ = *(long *)(local_88._0_8_ + 0x50);
          *(long *)(local_88._0_8_ + 0x50) = 0;
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::_M_insert_rval((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                            *)(local_88 + 0x10),(const_iterator)local_88._16_8_,
                           (value_type *)(local_88 + 8));
          if ((pointer)local_88._8_8_ != (pointer)0x0) {
            (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                           *)local_88._8_8_)->
                        super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                        )._M_t.
                        super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                        .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                       _M_head_impl)->pos).line)();
          }
          _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
               *(__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                (uVar7 + 0x48);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar7 + 0x48))->_M_allocated_capacity = 0;
          if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_88._0_8_ !=
              (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
            lVar4 = *(long *)local_88._0_8_;
            local_88._0_8_ =
                 _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
            (**(code **)(lVar4 + 8))();
            _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_88._0_8_
            ;
          }
          local_88._0_8_ =
               _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        } while (*(int *)&(((string *)(local_88._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12);
      }
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        *)(local_88 + 0x10),(const_iterator)local_88._16_8_,(value_type *)local_88);
      pLVar2 = in_RSI->lexer;
      pLVar9 = (Lexer *)operator_new(0x50);
      UseExpr::UseExpr((UseExpr *)pLVar9,pLVar2,(Position *)(local_88 + 0x30),
                       (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        *)(local_88 + 0x10));
      local_88._8_8_ = (pointer)0x0;
      this->lexer = pLVar9;
      std::unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_> *)
                 (local_88 + 8));
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)(local_88 + 0x10));
      if ((Expr *)local_88._0_8_ == (Expr *)0x0) {
        return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)this;
      }
      (**(code **)(*(long *)local_88._0_8_ + 8))();
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)this;
    }
  }
  this->lexer = (Lexer *)0x0;
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUse() noexcept {
  sanityExpect(TokenType::TOK_KW_USE);
  if (expect(TokenType::TOK_KW_MOD)) {
    const Token *tok = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    return std::make_unique<ProgNameExpr>(lexer, tok);
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    return nullptr;

  Position pos(expr->getPosition());

  Exprs exprs;
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    exprs.insert(exprs.begin(), biopexpr.getRightPtr());
    expr = biopexpr.getLeftPtr();
  }

  exprs.insert(exprs.begin(), std::move(expr));

  return std::make_unique<UseExpr>(lexer, pos, std::move(exprs));
}